

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O0

void __thiscall cmFileCopier::NotAfterMatch(cmFileCopier *this,string *arg)

{
  cmCommand *this_00;
  ostream *poVar1;
  string local_1c0;
  ostringstream local_190 [8];
  ostringstream e;
  string *arg_local;
  cmFileCopier *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar1 = std::operator<<((ostream *)local_190,"option ");
  poVar1 = std::operator<<(poVar1,(string *)arg);
  std::operator<<(poVar1," may not appear after PATTERN or REGEX.");
  this_00 = &this->FileCommand->super_cmCommand;
  std::__cxx11::ostringstream::str();
  cmCommand::SetError(this_00,&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  this->Doing = 1;
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return;
}

Assistant:

void NotAfterMatch(std::string const& arg)
    {
    std::ostringstream e;
    e << "option " << arg << " may not appear after PATTERN or REGEX.";
    this->FileCommand->SetError(e.str());
    this->Doing = DoingError;
    }